

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O0

int coda_cursor_goto(coda_cursor_conflict *cursor,char *path)

{
  int iVar1;
  bool bVar2;
  int local_40;
  int local_3c;
  int n;
  int result;
  int end;
  int start;
  long index;
  coda_type *type;
  char *path_local;
  coda_cursor_conflict *cursor_local;
  
  index = 0;
  result = 0;
  type = (coda_type *)path;
  path_local = (char *)cursor;
  if (*path == '/') {
    iVar1 = coda_cursor_goto_root(cursor);
    if (iVar1 != 0) {
      return -1;
    }
    if ((((*(char *)((long)&type->format + (long)(result + 1)) == '\0') ||
         (*(char *)((long)&type->format + (long)(result + 1)) == '/')) ||
        (*(char *)((long)&type->format + (long)(result + 1)) == '[')) ||
       (*(char *)((long)&type->format + (long)(result + 1)) == '@')) {
      result = result + 1;
    }
  }
  while( true ) {
    while( true ) {
      while( true ) {
        if (*(char *)((long)&type->format + (long)result) == '\0') {
          return 0;
        }
        if (*(char *)((long)&type->format + (long)result) != '@') break;
        iVar1 = coda_cursor_goto_attributes((coda_cursor_conflict *)path_local);
        if (iVar1 != 0) {
          return -1;
        }
        iVar1 = result + 1;
        n = iVar1;
        while( true ) {
          bVar2 = false;
          if (((*(char *)((long)&type->format + (long)n) != '\0') &&
              (bVar2 = false, *(char *)((long)&type->format + (long)n) != '/')) &&
             (bVar2 = false, *(char *)((long)&type->format + (long)n) != '[')) {
            bVar2 = *(char *)((long)&type->format + (long)n) != '@';
          }
          if (!bVar2) break;
          n = n + 1;
        }
        if ((n != result + 2) || (*(char *)((long)&type->format + (long)iVar1) != '.')) {
          if ((n == result + 3) &&
             ((*(char *)((long)&type->format + (long)iVar1) == '.' &&
              (*(char *)((long)&type->format + (long)(result + 2)) == '.')))) {
            result = iVar1;
            iVar1 = coda_cursor_goto_parent((coda_cursor_conflict *)path_local);
            if (iVar1 != 0) {
              return -1;
            }
          }
          else if (iVar1 < n) {
            result = iVar1;
            iVar1 = coda_cursor_get_type((coda_cursor_conflict *)path_local,(coda_type **)&index);
            if (iVar1 != 0) {
              return -1;
            }
            iVar1 = coda_type_get_record_field_index_from_name_n
                              ((coda_type *)index,(char *)((long)&type->format + (long)result),
                               n - result,(long *)&end);
            if (iVar1 != 0) {
              return -1;
            }
            iVar1 = coda_cursor_goto_record_field_by_index((coda_cursor_conflict *)path_local,_end);
            if (iVar1 != 0) {
              return -1;
            }
          }
        }
        result = n;
      }
      if (*(char *)((long)&type->format + (long)result) == '[') break;
      if (*(char *)((long)&type->format + (long)result) == '/') {
        result = result + 1;
      }
      else if (0 < result) {
        coda_set_error(-100,"invalid path \'%s\' (missing \'/\'?)",type);
        return -1;
      }
      n = result;
      while( true ) {
        bVar2 = false;
        if (((*(char *)((long)&type->format + (long)n) != '\0') &&
            (bVar2 = false, *(char *)((long)&type->format + (long)n) != '/')) &&
           (bVar2 = false, *(char *)((long)&type->format + (long)n) != '[')) {
          bVar2 = *(char *)((long)&type->format + (long)n) != '@';
        }
        if (!bVar2) break;
        n = n + 1;
      }
      if ((n != result + 1) || (*(char *)((long)&type->format + (long)result) != '.')) {
        if ((n == result + 2) &&
           ((*(char *)((long)&type->format + (long)result) == '.' &&
            (*(char *)((long)&type->format + (long)(result + 1)) == '.')))) {
          iVar1 = coda_cursor_goto_parent((coda_cursor_conflict *)path_local);
          if (iVar1 != 0) {
            return -1;
          }
        }
        else {
          iVar1 = coda_cursor_get_type((coda_cursor_conflict *)path_local,(coda_type **)&index);
          if (iVar1 != 0) {
            return -1;
          }
          iVar1 = coda_type_get_record_field_index_from_name_n
                            ((coda_type *)index,(char *)((long)&type->format + (long)result),
                             n - result,(long *)&end);
          if (iVar1 != 0) {
            return -1;
          }
          iVar1 = coda_cursor_goto_record_field_by_index((coda_cursor_conflict *)path_local,_end);
          if (iVar1 != 0) {
            return -1;
          }
        }
      }
      result = n;
    }
    result = result + 1;
    n = result;
    while( true ) {
      bVar2 = false;
      if (*(char *)((long)&type->format + (long)n) != '\0') {
        bVar2 = *(char *)((long)&type->format + (long)n) != ']';
      }
      if (!bVar2) break;
      n = n + 1;
    }
    if (*(char *)((long)&type->format + (long)n) == '\0') {
      coda_set_error(-100,"invalid path \'%s\' (missing \']\')",type);
      return -1;
    }
    if (result == n) {
      coda_set_error(-100,"invalid array index \'\' in path");
      return -1;
    }
    local_3c = __isoc99_sscanf((long)&type->format + (long)result,"%ld%n",&end,&local_40);
    if ((local_3c != 1) || (local_40 != n - result)) break;
    iVar1 = coda_cursor_goto_array_element_by_index((coda_cursor_conflict *)path_local,_end);
    if (iVar1 != 0) {
      return -1;
    }
    result = n + 1;
  }
  coda_set_error(-100,"invalid array index \'%.*s\' in path",(ulong)(uint)(n - result),
                 (long)&type->format + (long)result);
  return -1;
}

Assistant:

LIBCODA_API int coda_cursor_goto(coda_cursor *cursor, const char *path)
{
    coda_type *type = NULL;
    long index;
    int start = 0;
    int end;

    if (path[start] == '/')
    {
        if (coda_cursor_goto_root(cursor) != 0)
        {
            return -1;
        }
        /* skip leading '/' if it is not followed by a record field name */
        if (path[start + 1] == '\0' || path[start + 1] == '/' || path[start + 1] == '[' || path[start + 1] == '@')
        {
            start++;
        }
    }

    while (path[start] != '\0')
    {
        if (path[start] == '@')
        {
            /* attribute */
            if (coda_cursor_goto_attributes(cursor) != 0)
            {
                return -1;
            }
            start++;
            end = start;
            while (path[end] != '\0' && path[end] != '/' && path[end] != '[' && path[end] != '@')
            {
                end++;
            }
            if (end == start + 1 && path[start] == '.')
            {
                /* stay at this position */
            }
            else if (end == start + 2 && path[start] == '.' && path[start + 1] == '.')
            {
                if (coda_cursor_goto_parent(cursor) != 0)
                {
                    return -1;
                }
            }
            else if (end > start)
            {
                if (coda_cursor_get_type(cursor, &type) != 0)
                {
                    return -1;
                }
                if (coda_type_get_record_field_index_from_name_n(type, &path[start], end - start, &index) != 0)
                {
                    return -1;
                }
                if (coda_cursor_goto_record_field_by_index(cursor, index) != 0)
                {
                    return -1;
                }
            }
            start = end;
        }
        else if (path[start] == '[')
        {
            int result;
            int n;

            /* array index */
            start++;
            end = start;
            while (path[end] != '\0' && path[end] != ']')
            {
                end++;
            }
            if (path[end] == '\0')
            {
                coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid path '%s' (missing ']')", path);
                return -1;
            }
            if (start == end)
            {
                coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid array index '' in path");
                return -1;
            }
            result = sscanf(&path[start], "%ld%n", &index, &n);
            if (result != 1 || n != end - start)
            {
                coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid array index '%.*s' in path", end - start,
                               &path[start]);
                return -1;
            }
            if (coda_cursor_goto_array_element_by_index(cursor, index) != 0)
            {
                return -1;
            }
            start = end + 1;
        }
        else
        {
            /* it is Ok to ommit a leading '/' when we start with a field name */
            if (path[start] == '/')
            {
                start++;
            }
            else if (start > 0)
            {
                coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid path '%s' (missing '/'?)", path);
                return -1;
            }
            end = start;
            while (path[end] != '\0' && path[end] != '/' && path[end] != '[' && path[end] != '@')
            {
                end++;
            }
            if (end == start + 1 && path[start] == '.')
            {
                /* stay at this position */
            }
            else if (end == start + 2 && path[start] == '.' && path[start + 1] == '.')
            {
                if (coda_cursor_goto_parent(cursor) != 0)
                {
                    return -1;
                }
            }
            else
            {
                if (coda_cursor_get_type(cursor, &type) != 0)
                {
                    return -1;
                }
                if (coda_type_get_record_field_index_from_name_n(type, &path[start], end - start, &index) != 0)
                {
                    return -1;
                }
                if (coda_cursor_goto_record_field_by_index(cursor, index) != 0)
                {
                    return -1;
                }
            }
            start = end;
        }
    }

    return 0;
}